

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

size_t __thiscall wallet::CWallet::KeypoolCountExternalKeys(CWallet *this)

{
  long lVar1;
  int iVar2;
  LegacyScriptPubKeyMan *this_00;
  size_t sVar3;
  _Base_ptr p_Var4;
  uint uVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = GetLegacyScriptPubKeyMan(this);
  if (this_00 == (LegacyScriptPubKeyMan *)0x0) {
    uVar5 = 0;
    for (p_Var4 = (this->m_external_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left;
        (_Rb_tree_header *)p_Var4 !=
        &(this->m_external_spk_managers)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      iVar2 = (**(code **)(*(long *)p_Var4[1]._M_parent + 0x90))();
      uVar5 = uVar5 + iVar2;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return (ulong)uVar5;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    sVar3 = LegacyScriptPubKeyMan::KeypoolCountExternalKeys(this_00);
    return sVar3;
  }
  __stack_chk_fail();
}

Assistant:

size_t CWallet::KeypoolCountExternalKeys() const
{
    AssertLockHeld(cs_wallet);

    auto legacy_spk_man = GetLegacyScriptPubKeyMan();
    if (legacy_spk_man) {
        return legacy_spk_man->KeypoolCountExternalKeys();
    }

    unsigned int count = 0;
    for (auto spk_man : m_external_spk_managers) {
        count += spk_man.second->GetKeyPoolSize();
    }

    return count;
}